

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

String xmrig::OclLib::getString(cl_device_id id,cl_device_info param)

{
  char *in_RDI;
  String SVar1;
  uint in_stack_0000000c;
  undefined4 in_stack_00000010;
  
  SVar1 = getOclString<int(*)(_cl_device_id*,unsigned_int,unsigned_long,void*,unsigned_long*),_cl_device_id*,unsigned_int>
                    ((_func_int__cl_device_id_ptr_uint_unsigned_long_void_ptr_unsigned_long_ptr *)id
                     ,(_cl_device_id *)CONCAT44(param,in_stack_00000010),in_stack_0000000c);
  SVar1.m_data = in_RDI;
  return SVar1;
}

Assistant:

xmrig::String xmrig::OclLib::getString(cl_device_id id, cl_device_info param) noexcept
{
    return getOclString(OclLib::getDeviceInfo, id, param);
}